

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O2

void __thiscall Dashel::PollStream::PollStream(PollStream *this,string *targetName)

{
  int iVar1;
  
  Stream::Stream((Stream *)&(this->super_SelectableStream).field_0x18,targetName);
  (this->super_SelectableStream).fd = -1;
  (this->super_SelectableStream).writeOnly = false;
  (this->super_SelectableStream).pollEvent = 1;
  (this->super_SelectableStream)._vptr_SelectableStream = (_func_int **)&PTR__PollStream_00126640;
  *(undefined ***)&(this->super_SelectableStream).field_0x18 = &PTR__PollStream_001266a8;
  ParameterSet::add((ParameterSet *)&(this->super_SelectableStream).field_0x48,
                    "tcppoll:host;port;connectionPort=-1;sock=-1");
  ParameterSet::add((ParameterSet *)
                    (&(this->super_SelectableStream).field_0x30 +
                    (long)(this->super_SelectableStream)._vptr_SelectableStream[-3]),
                    (targetName->_M_dataplus)._M_p);
  iVar1 = getOrCreateSocket((ParameterSet *)
                            (&(this->super_SelectableStream).field_0x30 +
                            (long)(this->super_SelectableStream)._vptr_SelectableStream[-3]));
  (this->super_SelectableStream).fd = iVar1;
  iVar1 = ParameterSet::get<int>
                    ((ParameterSet *)
                     (&(this->super_SelectableStream).field_0x30 +
                     (long)(this->super_SelectableStream)._vptr_SelectableStream[-3]),"sock");
  (this->super_SelectableStream).field_0x11 = -1 < (this->super_SelectableStream).fd && iVar1 < 0;
  return;
}

Assistant:

explicit PollStream(const std::string& targetName) :
			Stream(targetName),
			SelectableStream(targetName)
		{
			target.add("tcppoll:host;port;connectionPort=-1;sock=-1");
			target.add(targetName.c_str());
			fd = getOrCreateSocket(target);
			dtorCloseSocket = target.get<int>("sock") < 0 && fd >= 0; // if getOrCreateSocket created the socket we will have to close it
		}